

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.h
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event::Event
          (Event *this,Event *other)

{
  this->type_ = other->type_;
  std::__cxx11::string::string((string *)&this->name_,(string *)&other->name_);
  DataPiece::DataPiece(&this->value_,&other->value_);
  (this->value_storage_)._M_dataplus._M_p = (pointer)&(this->value_storage_).field_2;
  (this->value_storage_)._M_string_length = 0;
  (this->value_storage_).field_2._M_local_buf[0] = '\0';
  DeepCopy(this);
  return;
}

Assistant:

Event(const Event& other)
          : type_(other.type_), name_(other.name_), value_(other.value_) {
        DeepCopy();
      }